

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PushUnaryMinus.cpp
# Opt level: O0

Clause * __thiscall Inferences::PushUnaryMinus::simplify(PushUnaryMinus *this,Clause *cl_)

{
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_TermIterators_hpp:860:12),_Kernel::TermList>_>
  i1;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_TermIterators_hpp:848:12),_Kernel::TermList>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_PushUnaryMinus_cpp:113:16),_Kernel::TermList>_>
  i2;
  uint uVar1;
  bool bVar2;
  uint uVar3;
  Literal **ppLVar4;
  Clause *pCVar5;
  Clause *in_RSI;
  Clause *result;
  Literal *litOut;
  Stack<Kernel::TermList> litStack;
  Literal *litIn;
  uint i;
  bool changed;
  Stack<Kernel::Literal_*> out;
  Clause *cl;
  SimplifyingInference1 *in_stack_fffffffffffffe28;
  Inference *in_stack_fffffffffffffe30;
  size_t in_stack_fffffffffffffe38;
  Stack<Kernel::Literal_*> *in_stack_fffffffffffffe40;
  Term *in_stack_fffffffffffffe58;
  anon_class_1_0_00000001 *in_stack_fffffffffffffe60;
  Clause *in_stack_fffffffffffffe98;
  anon_class_8_1_af659594_for__func in_stack_fffffffffffffea0;
  Literal *in_stack_fffffffffffffea8;
  IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_TermIterators_hpp:860:12),_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_TermIterators_hpp:848:12),_Kernel::TermList>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_PushUnaryMinus_cpp:113:16),_Kernel::TermList>_>_>_>_>
  *in_stack_fffffffffffffeb8;
  undefined8 in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  Term *in_stack_ffffffffffffff20;
  SimplifyingInference1 *in_stack_ffffffffffffff28;
  Inference *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  Stack<Kernel::TermList> local_80;
  Literal *local_60;
  uint local_48;
  byte local_41;
  Clause *local_20;
  Clause *local_18;
  Clause *local_8;
  
  local_18 = in_RSI;
  bVar2 = Kernel::Unit::isTheoryAxiom((Unit *)0x828144);
  if (bVar2) {
    local_8 = local_18;
  }
  else {
    local_20 = local_18;
    Kernel::Clause::size(local_18);
    Lib::Stack<Kernel::Literal_*>::Stack(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    local_41 = 0;
    local_48 = 0;
    while( true ) {
      uVar1 = local_48;
      uVar3 = Kernel::Clause::size(local_20);
      if (uVar3 <= uVar1) break;
      ppLVar4 = Kernel::Clause::operator[](local_20,local_48);
      local_60 = *ppLVar4;
      Kernel::anon_class_1_0_00000001::operator()
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      Kernel::anon_class_1_0_00000001::operator()
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      in_stack_fffffffffffffe58 = in_stack_ffffffffffffff20;
      in_stack_fffffffffffffe28 = in_stack_ffffffffffffff28;
      in_stack_fffffffffffffe30 = in_stack_ffffffffffffff30;
      Lib::
      IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Kernel::$_1::operator()(Kernel::Term_const*)const::{lambda(auto:1)#1},Kernel::TermList>>
      ::map<Inferences::PushUnaryMinus::simplify(Kernel::Clause*)::__0>
                ((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_TermIterators_hpp:848:12),_Kernel::TermList>_>
                  *)in_stack_fffffffffffffe98,in_stack_fffffffffffffea0);
      i1._iter._inner._next = (int)in_stack_ffffffffffffff18;
      i1._iter._inner._from = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
      i1._iter._func.term = (Term *)in_stack_ffffffffffffff10;
      i1._iter._16_8_ = in_stack_fffffffffffffe58;
      i2._iter._inner._func.term = (Term *)in_stack_fffffffffffffe30;
      i2._iter._func.changed = (bool *)in_stack_fffffffffffffe28;
      i2._iter._inner._inner._next = (int)in_stack_ffffffffffffff38;
      i2._iter._inner._inner._from = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
      i2._iter._inner._16_8_ = in_stack_ffffffffffffff40;
      in_stack_ffffffffffffff20 = in_stack_fffffffffffffe58;
      in_stack_ffffffffffffff28 = in_stack_fffffffffffffe28;
      in_stack_ffffffffffffff30 = in_stack_fffffffffffffe30;
      Lib::operator()(i1,i2);
      Lib::
      IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/TermIterators.hpp:860:12),_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/TermIterators.hpp:848:12),_Kernel::TermList>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/PushUnaryMinus.cpp:113:16),_Kernel::TermList>_>_>_>_>
      ::collect<Lib::Stack>(in_stack_fffffffffffffeb8);
      if ((local_41 & 1) == 0) {
        Lib::Stack<Kernel::Literal_*>::push
                  ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffe30,
                   (Literal *)in_stack_fffffffffffffe28);
      }
      else {
        Lib::Stack<Kernel::TermList>::begin(&local_80);
        Kernel::Literal::create
                  (in_stack_fffffffffffffea8,(TermList *)in_stack_fffffffffffffea0.changed);
        Lib::Stack<Kernel::Literal_*>::push
                  ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffe30,
                   (Literal *)in_stack_fffffffffffffe28);
      }
      Lib::Stack<Kernel::TermList>::~Stack((Stack<Kernel::TermList> *)in_stack_fffffffffffffe30);
      local_48 = local_48 + 1;
    }
    if ((local_41 & 1) == 0) {
      local_8 = local_18;
    }
    else {
      Kernel::SimplifyingInference1::SimplifyingInference1
                ((SimplifyingInference1 *)&stack0xfffffffffffffe90,EVALUATION,local_18);
      Kernel::Inference::Inference(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      pCVar5 = Kernel::Clause::fromStack
                         ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffea0.changed,
                          (Inference *)in_stack_fffffffffffffe98);
      Kernel::Inference::~Inference((Inference *)&stack0xfffffffffffffea0);
      local_8 = pCVar5;
    }
    Lib::Stack<Kernel::Literal_*>::~Stack((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffe30);
  }
  return local_8;
}

Assistant:

Clause* PushUnaryMinus::simplify(Clause* cl_) 
{
  DEBUG("in:  ", *cl_)
  if (cl_->isTheoryAxiom()) 
    return cl_;

  auto& cl = *cl_;
  Stack<Literal*> out(cl.size());

  bool changed = false;

  for (unsigned i = 0; i < cl.size(); i++) {
    auto litIn = cl[i];
    auto litStack = concatIters(
        typeArgIter(litIn),
        termArgIter(litIn)
          .map([&](auto tIn) {
            auto tOut = pushUMinus(UMinus::None, tIn);
            changed = changed || tIn != tOut;
            return tOut;
          })
        ).template collect<Stack>();
    if(changed){
      auto litOut = Literal::create(litIn, litStack.begin());
      out.push(litOut);
    } else {
      out.push(litIn);
    }
  }

  if (!changed) {
    return cl_;
  } else {
    auto result = Clause::fromStack(out, SimplifyingInference1(InferenceRule::EVALUATION, cl_));
    DEBUG("out: ", *result)
    return result;
  }
}